

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O0

cmDependInformation * __thiscall
cmLBDepend::GetDependInformation(cmLBDepend *this,char *file,char *extraPath)

{
  bool bVar1;
  pointer ppVar2;
  cmLBDepend *pcVar3;
  mapped_type *ppcVar4;
  string local_a8;
  cmLBDepend *local_88;
  cmDependInformation *info;
  iterator local_78;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependInformation_*>_>
  local_70 [3];
  iterator local_58;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependInformation_*>_>
  local_50;
  const_iterator result;
  string fullPath;
  char *extraPath_local;
  char *file_local;
  cmLBDepend *this_local;
  
  FullPath_abi_cxx11_((string *)&result,this,file,extraPath);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependInformation_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependInformation_*>_>_>
       ::find(&this->DependInformationMap,(string *)&result);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependInformation_*>_>
  ::_Rb_tree_const_iterator(&local_50,&local_58);
  local_78._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependInformation_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependInformation_*>_>_>
       ::end(&this->DependInformationMap);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependInformation_*>_>
  ::_Rb_tree_const_iterator(local_70,&local_78);
  bVar1 = std::operator!=(&local_50,local_70);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependInformation_*>_>
             ::operator->(&local_50);
    this_local = (cmLBDepend *)ppVar2->second;
  }
  else {
    pcVar3 = (cmLBDepend *)operator_new(0xa0);
    cmDependInformation::cmDependInformation((cmDependInformation *)pcVar3);
    local_88 = pcVar3;
    std::__cxx11::string::operator=
              ((string *)((pcVar3->IncludeFileRegularExpression).startp + 6),(string *)&result);
    cmsys::SystemTools::GetFilenamePath(&local_a8,(string *)&result);
    std::__cxx11::string::operator=
              ((string *)(local_88->IncludeFileRegularExpression).endp,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::operator=
              ((string *)((local_88->IncludeFileRegularExpression).endp + 4),file);
    pcVar3 = local_88;
    ppcVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependInformation_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependInformation_*>_>_>
              ::operator[](&this->DependInformationMap,(key_type *)&result);
    *ppcVar4 = (mapped_type)pcVar3;
    this_local = local_88;
  }
  info._4_4_ = 1;
  std::__cxx11::string::~string((string *)&result);
  return (cmDependInformation *)this_local;
}

Assistant:

cmDependInformation* GetDependInformation(const char* file,
                                            const char *extraPath)
  {
    // Get the full path for the file so that lookup is unambiguous.
    std::string fullPath = this->FullPath(file, extraPath);

    // Try to find the file's instance of cmDependInformation.
    DependInformationMapType::const_iterator result =
        this->DependInformationMap.find(fullPath);
    if(result != this->DependInformationMap.end())
      {
      // Found an instance, return it.
      return result->second;
      }
    else
      {
      // Didn't find an instance.  Create a new one and save it.
      cmDependInformation* info = new cmDependInformation;
      info->FullPath = fullPath;
      info->PathOnly = cmSystemTools::GetFilenamePath(fullPath);
      info->IncludeName = file;
      this->DependInformationMap[fullPath] = info;
      return info;
      }
  }